

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_parallelogram_shared.h
# Opt level: O0

bool draco::ComputeParallelogramPrediction<draco::MeshAttributeCornerTable,int>
               (int data_entry_id,CornerIndex ci,MeshAttributeCornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *in_data,int num_components
               ,int *out_prediction)

{
  bool bVar1;
  CornerIndex CVar2;
  vector<int,_std::allocator<int>_> *in_RCX;
  MeshAttributeCornerTable *in_RDX;
  undefined4 in_ESI;
  CornerIndex in_EDI;
  int *in_R8;
  int in_R9D;
  int64_t result;
  int64_t in_data_opp_off;
  int64_t in_data_prev_off;
  int64_t in_data_next_off;
  int c;
  int v_prev_off;
  int v_next_off;
  int v_opp_off;
  int vert_prev;
  int vert_next;
  int vert_opp;
  CornerIndex oci;
  MeshAttributeCornerTable *in_stack_ffffffffffffff98;
  CornerIndex in_stack_ffffffffffffffa0;
  int local_54;
  int local_40;
  int local_3c;
  int in_stack_ffffffffffffffc8;
  bool local_1;
  
  CVar2 = MeshAttributeCornerTable::Opposite(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                    ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                     &stack0xffffffffffffffd0,
                     (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex);
  if (bVar1) {
    local_1 = false;
  }
  else {
    GetParallelogramEntries<draco::MeshAttributeCornerTable>
              (in_EDI,in_RDX,in_RCX,in_R8,(int *)CONCAT44(in_R9D,CVar2.value_),
               (int *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
    if (((in_stack_ffffffffffffffc8 < (int)in_EDI.value_) && (local_3c < (int)in_EDI.value_)) &&
       (local_40 < (int)in_EDI.value_)) {
      for (local_54 = 0; local_54 < in_R9D; local_54 = local_54 + 1) {
        *(int *)(in_data_opp_off + (long)local_54 * 4) =
             (in_R8[local_3c * in_R9D + local_54] + in_R8[local_40 * in_R9D + local_54]) -
             in_R8[in_stack_ffffffffffffffc8 * in_R9D + local_54];
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool ComputeParallelogramPrediction(
    int data_entry_id, const CornerIndex ci, const CornerTableT *table,
    const std::vector<int32_t> &vertex_to_data_map, const DataTypeT *in_data,
    int num_components, DataTypeT *out_prediction) {
  const CornerIndex oci = table->Opposite(ci);
  if (oci == kInvalidCornerIndex) {
    return false;
  }
  int vert_opp, vert_next, vert_prev;
  GetParallelogramEntries<CornerTableT>(oci, table, vertex_to_data_map,
                                        &vert_opp, &vert_next, &vert_prev);
  if (vert_opp < data_entry_id && vert_next < data_entry_id &&
      vert_prev < data_entry_id) {
    // Apply the parallelogram prediction.
    const int v_opp_off = vert_opp * num_components;
    const int v_next_off = vert_next * num_components;
    const int v_prev_off = vert_prev * num_components;
    for (int c = 0; c < num_components; ++c) {
      const int64_t in_data_next_off = in_data[v_next_off + c];
      const int64_t in_data_prev_off = in_data[v_prev_off + c];
      const int64_t in_data_opp_off = in_data[v_opp_off + c];
      const int64_t result =
          (in_data_next_off + in_data_prev_off) - in_data_opp_off;

      out_prediction[c] = static_cast<DataTypeT>(result);
    }
    return true;
  }
  return false;  // Not all data is available for prediction
}